

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  lu_byte x;
  DumpState D;
  undefined8 local_50;
  DumpState local_48;
  
  local_48.status = 0;
  local_48.L = L;
  local_48.writer = w;
  local_48.data = data;
  local_48.strip = strip;
  DumpBlock("\x1bRavi",5,&local_48);
  local_50._0_1_ = 0x53;
  DumpBlock(&local_50,1,&local_48);
  local_50._0_1_ = 1;
  DumpBlock(&local_50,1,&local_48);
  DumpBlock(anon_var_dwarf_11ef1,6,&local_48);
  local_50._0_1_ = 4;
  DumpBlock(&local_50,1,&local_48);
  local_50._0_1_ = 8;
  DumpBlock(&local_50,1,&local_48);
  local_50._0_1_ = 4;
  DumpBlock(&local_50,1,&local_48);
  local_50._0_1_ = 8;
  DumpBlock(&local_50,1,&local_48);
  local_50 = CONCAT71(local_50._1_7_,8);
  DumpBlock(&local_50,1,&local_48);
  local_50 = 0x5678;
  DumpBlock(&local_50,8,&local_48);
  local_50 = 0x4077280000000000;
  DumpBlock(&local_50,8,&local_48);
  local_50 = CONCAT71(local_50._1_7_,(char)f->sizeupvalues);
  DumpBlock(&local_50,1,&local_48);
  DumpFunction(f,(TString *)0x0,&local_48);
  return local_48.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  DumpHeader(&D);
  DumpByte(f->sizeupvalues, &D);
  DumpFunction(f, NULL, &D);
  return D.status;
}